

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O3

int xmlUTF8Strsize(xmlChar *utf,int len)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte bVar5;
  xmlChar *ptr;
  
  pbVar4 = utf;
  iVar3 = 0;
  if (0 < len && utf != (xmlChar *)0x0) {
    do {
      bVar5 = *pbVar4;
      if (bVar5 == 0) break;
      pbVar4 = pbVar4 + 1;
      if ((bVar5 & 0x40) != 0 && (char)bVar5 < '\0') {
        do {
          if (*pbVar4 == 0) break;
          pbVar4 = pbVar4 + 1;
          bVar2 = bVar5 & 0x20;
          bVar5 = bVar5 * '\x02';
        } while (bVar2 != 0);
      }
      bVar1 = 1 < len;
      len = len + -1;
    } while (bVar1);
    iVar3 = (int)((long)pbVar4 - (long)utf);
    if (0x7fffffff < (ulong)((long)pbVar4 - (long)utf)) {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
xmlUTF8Strsize(const xmlChar *utf, int len) {
    const xmlChar *ptr=utf;
    int ch;
    size_t ret;

    if (utf == NULL)
        return(0);

    if (len <= 0)
        return(0);

    while ( len-- > 0) {
        if ( !*ptr )
            break;
        if ( (ch = *ptr++) & 0x80)
            while ((ch<<=1) & 0x80 ) {
		if (*ptr == 0) break;
                ptr++;
	    }
    }
    ret = ptr - utf;
    return (ret > INT_MAX ? 0 : ret);
}